

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

void deqp::gls::anon_unknown_1::genRandomCoords
               (Random *rng,vector<unsigned_char,_std::allocator<unsigned_char>_> *coords,
               size_t offset,size_t size)

{
  value_type vVar1;
  deUint8 dVar2;
  deUint32 dVar3;
  reference pvVar4;
  ulong uVar5;
  deUint8 local_6c;
  deUint8 local_6a;
  int local_60;
  deUint8 local_5c [4];
  int i_2;
  deUint8 indices_1 [12];
  size_t posY;
  size_t posX;
  deUint8 index;
  int i_1;
  undefined1 auStack_30 [3];
  deUint8 indices [4];
  deUint8 xBits;
  int i;
  deUint8 bitMask;
  deUint8 bits;
  size_t size_local;
  size_t offset_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *coords_local;
  Random *rng_local;
  
  indices[3] = '\x03';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(coords,size);
  for (_auStack_30 = 0; _auStack_30 < (int)size; _auStack_30 = _auStack_30 + 1) {
    dVar3 = de::Random::getUint32(rng);
    i_1._3_1_ = (byte)dVar3 & 3;
    dVar2 = extend2BitsToByte(i_1._3_1_);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (coords,(long)_auStack_30);
    *pvVar4 = dVar2;
  }
  index = extend2BitsToByte('\0');
  i_1._0_1_ = extend2BitsToByte('\x01');
  i_1._1_1_ = extend2BitsToByte('\x02');
  i_1._2_1_ = extend2BitsToByte('\x03');
  for (posX._4_4_ = 0; posX._4_4_ < 4; posX._4_4_ = posX._4_4_ + 1) {
    uVar5 = (ulong)(&index)[posX._4_4_] * 2;
    indices_1._4_8_ = (ulong)(&index)[posX._4_4_] * 2 + 1;
    if ((offset <= uVar5) && (uVar5 < offset + size)) {
      if (posX._4_4_ % 2 == 0) {
        local_6a = extend2BitsToByte('\0');
      }
      else {
        local_6a = extend2BitsToByte('\x03');
      }
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (coords,uVar5 - offset);
      *pvVar4 = local_6a;
    }
    if ((offset <= (ulong)indices_1._4_8_) && ((ulong)indices_1._4_8_ < offset + size)) {
      if (posX._4_4_ / 2 == 1) {
        local_6c = extend2BitsToByte('\x03');
      }
      else {
        local_6c = extend2BitsToByte('\0');
      }
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (coords,indices_1._4_8_ - offset);
      *pvVar4 = local_6c;
    }
  }
  local_5c[0] = extend2BitsToByte('\0');
  local_5c[1] = extend2BitsToByte('\x03');
  local_5c[2] = extend2BitsToByte('\x01');
  local_5c[3] = extend2BitsToByte('\x01');
  i_2._0_1_ = extend2BitsToByte('\x02');
  i_2._1_1_ = extend2BitsToByte('\0');
  i_2._2_1_ = extend2BitsToByte('\0');
  i_2._3_1_ = extend2BitsToByte('\x02');
  indices_1[0] = extend2BitsToByte('\x01');
  indices_1[1] = extend2BitsToByte('\x01');
  indices_1[2] = extend2BitsToByte('\x03');
  indices_1[3] = extend2BitsToByte('\0');
  for (local_60 = (int)offset; local_60 < 0xc && local_60 < (int)offset + (int)size;
      local_60 = local_60 + 1) {
    vVar1 = local_5c[local_60];
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (coords,(long)local_60 - offset);
    *pvVar4 = vVar1;
  }
  return;
}

Assistant:

void genRandomCoords (de::Random rng, vector<deUint8>& coords, size_t offset, size_t size)
{
	const deUint8 bits		= 2;
	const deUint8 bitMask	= deUint8((0x1u << bits) - 1);

	coords.resize(size);

	for (int i = 0; i < (int)size; i++)
	{
		const deUint8 xBits = deUint8(rng.getUint32() & bitMask);
		coords[i] = extend2BitsToByte(xBits);
	}

	// Fill indices with nice quad
	{
		const deUint8 indices[] =
		{
			extend2BitsToByte(0x0u),
			extend2BitsToByte(0x1u),
			extend2BitsToByte(0x2u),
			extend2BitsToByte(0x3u)
		};

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(indices); i++)
		{
			const deUint8	index	= indices[i];
			const size_t	posX	= (size_t(index) * 2) + 0;
			const size_t	posY	= (size_t(index) * 2) + 1;

			if (posX >= offset && posX < offset+size)
				coords[posX - offset] = ((i % 2) == 0 ? extend2BitsToByte(0x0u) : extend2BitsToByte(0x3u));

			if (posY >= offset && posY < offset+size)
				coords[posY - offset] = ((i / 2) == 1 ? extend2BitsToByte(0x3u) : extend2BitsToByte(0x0u));
		}
	}

	// Fill beginning of buffer
	{
		const deUint8 indices[] =
		{
			extend2BitsToByte(0x0u),
			extend2BitsToByte(0x3u),
			extend2BitsToByte(0x1u),

			extend2BitsToByte(0x1u),
			extend2BitsToByte(0x2u),
			extend2BitsToByte(0x0u),

			extend2BitsToByte(0x0u),
			extend2BitsToByte(0x2u),
			extend2BitsToByte(0x1u),

			extend2BitsToByte(0x1u),
			extend2BitsToByte(0x3u),
			extend2BitsToByte(0x0u)
		};

		for (int i = (int)offset; i < DE_LENGTH_OF_ARRAY(indices) && i < (int)(offset + size); i++)
			coords[i-offset] = indices[i];
	}
}